

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void wasm::SimplifyLocals<true,_false,_true>::visitPost
               (SimplifyLocals<true,_false,_true> *self,Expression **currp)

{
  Expression *pEVar1;
  bool bVar2;
  iterator __position;
  LocalSet *this;
  size_type sVar3;
  Id IVar4;
  Drop *output;
  LocalSet *set;
  pair<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo> local_4d0;
  SinkableInfo local_350;
  undefined1 local_1d8 [8];
  EffectAnalyzer effects;
  LocalGet originalGet;
  LocalSet *local_40;
  Index local_34 [2];
  Index index;
  
  set = (LocalSet *)*currp;
  effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       CONCAT44(effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,8);
  IVar4 = (((SpecificExpression<(wasm::Expression::Id)8> *)
           &set->super_SpecificExpression<(wasm::Expression::Id)9>)->super_Expression)._id;
  local_40 = set;
  if (IVar4 == LocalGetId) {
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         *(size_t *)
          &((SpecificExpression<(wasm::Expression::Id)8> *)
           &set->super_SpecificExpression<(wasm::Expression::Id)9>)->super_Expression;
    optimizeLocalGet(self,(LocalGet *)set);
    set = (LocalSet *)*currp;
    IVar4 = (set->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id;
    local_40 = (LocalSet *)&effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
  }
  if (IVar4 == LocalSetId) {
    __position = std::
                 _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
                 ::find(&(self->sinkables)._M_t,&set->index);
    if ((_Rb_tree_header *)__position._M_node !=
        &(self->sinkables)._M_t._M_impl.super__Rb_tree_header) {
      this = Expression::cast<wasm::LocalSet>(*(Expression **)__position._M_node[1]._M_parent);
      bVar2 = LocalSet::isTee(this);
      if (bVar2) {
        __assert_fail("!previous->isTee()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x1a1,
                      "static void wasm::SimplifyLocals<true, false>::visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = false, allowNesting = true]"
                     );
      }
      pEVar1 = this->value;
      (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = DropId;
      (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      *(Expression **)&this->index = pEVar1;
      Drop::finalize((Drop *)this);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>,std::_Select1st<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>,std::_Select1st<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
                          *)&self->sinkables,__position);
      self->anotherCycle = true;
    }
  }
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_1d8,
             &((self->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
               ).super_Pass.runner)->options,
             (self->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .currModule);
  bVar2 = EffectAnalyzer::checkPost((EffectAnalyzer *)local_1d8,(Expression *)local_40);
  if (bVar2) {
    checkInvalidations(self,(EffectAnalyzer *)local_1d8);
  }
  if ((IVar4 == LocalSetId) && (bVar2 = canSink(self,set), bVar2)) {
    local_34[0] = set->index;
    sVar3 = std::
            map<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
            ::count(&self->sinkables,local_34);
    if (sVar3 != 0) {
      __assert_fail("self->sinkables.count(index) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x1b2,
                    "static void wasm::SimplifyLocals<true, false>::visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = false, allowNesting = true]"
                   );
    }
    SinkableInfo::SinkableInfo
              (&local_350,currp,
               &((self->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                 ).super_Pass.runner)->options,
               (self->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
               ).
               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               .
               super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               .
               super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               .currModule);
    local_4d0.first = local_34[0];
    SinkableInfo::SinkableInfo(&local_4d0.second,&local_350);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>,std::_Select1st<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
    ::_M_emplace_unique<std::pair<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>,std::_Select1st<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
                *)&self->sinkables,&local_4d0);
    EffectAnalyzer::~EffectAnalyzer(&local_4d0.second.effects);
    EffectAnalyzer::~EffectAnalyzer(&local_350.effects);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1d8);
  return;
}

Assistant:

static void
  visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
            Expression** currp) {
    // Handling invalidations in the case where the current node is a get
    // that we sink into is not trivial in general. In the simple case,
    // all current sinkables are compatible with each other (otherwise one
    // would have invalidated a previous one, and removed it). Given that, if
    // we sink one of the sinkables, then that new code cannot invalidate any
    // other sinkable - we've already compared them. However, a tricky case
    // is when a sinkable contains another sinkable,
    //
    //  (local.set $x
    //   (block (result i32)
    //    (A (local.get $y))
    //    (local.set $y B)
    //   )
    //  )
    //  (C (local.get $y))
    //  (D (local.get $x))
    //
    // If we sink the set of $y, we have
    //
    //  (local.set $x
    //   (block (result i32)
    //    (A (local.get $y))
    //    (nop)
    //   )
    //  )
    //  (C B)
    //  (D (local.get $x))
    //
    // There is now a risk that the set of $x should be invalidated, because
    // if we sink it then A may happen after B (imagine that B contains
    // something dangerous for that). To verify the risk, we could recursively
    // scan all of B, but that is less efficient. Instead, the key thing is
    // that if we sink out an inner part of a set, we should just leave further
    // work on it to a later iteration. This is achieved by checking for
    // invalidation on the original node, the local.get $y, which is guaranteed
    // to invalidate the parent whose inner part was removed (since the inner
    // part has a set, and the original node is a get of that same local).
    //
    // To implement this, if the current node is a get, note it and use it
    // for invalidations later down. We must note it since optimizing the get
    // may perform arbitrary changes to the graph, including reuse the get.

    Expression* original = *currp;

    LocalGet originalGet;

    if (auto* get = (*currp)->dynCast<LocalGet>()) {
      // Note: no visitor for LocalGet, so that we can handle it here.
      originalGet = *get;
      original = &originalGet;
      self->optimizeLocalGet(get);
    }

    // perform main LocalSet processing here, since we may be the result of
    // replaceCurrent, i.e., no visitor for LocalSet, like LocalGet above.
    auto* set = (*currp)->dynCast<LocalSet>();

    if (set) {
      // if we see a set that was already potentially-sinkable, then the
      // previous store is dead, leave just the value
      auto found = self->sinkables.find(set->index);
      if (found != self->sinkables.end()) {
        auto* previous = (*found->second.item)->template cast<LocalSet>();
        assert(!previous->isTee());
        auto* previousValue = previous->value;
        Drop* drop = ExpressionManipulator::convert<LocalSet, Drop>(previous);
        drop->value = previousValue;
        drop->finalize();
        self->sinkables.erase(found);
        self->anotherCycle = true;
      }
    }

    EffectAnalyzer effects(self->getPassOptions(), *self->getModule());
    if (effects.checkPost(original)) {
      self->checkInvalidations(effects);
    }

    if (set && self->canSink(set)) {
      Index index = set->index;
      assert(self->sinkables.count(index) == 0);
      self->sinkables.emplace(std::pair{
        index,
        SinkableInfo(currp, self->getPassOptions(), *self->getModule())});
    }

    if (!allowNesting) {
      self->expressionStack.pop_back();
    }
  }